

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::FmaCase::compare(FmaCase *this,void **inputs,void **outputs)

{
  float fVar1;
  uint uVar2;
  ostream *os;
  ulong uVar3;
  ostringstream *this_00;
  bool bVar4;
  double dVar5;
  double dVar6;
  Interval ref;
  Interval local_48;
  
  uVar2 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  if (0 < (int)uVar2) {
    uVar3 = 0;
    bVar4 = false;
    do {
      fVar1 = *(float *)((long)*outputs + uVar3 * 4);
      fma((double)(ulong)*(uint *)((long)*inputs + uVar3 * 4),
          (double)(ulong)*(uint *)((long)inputs[1] + uVar3 * 4),
          (double)(ulong)*(uint *)((long)inputs[2] + uVar3 * 4));
      dVar5 = INFINITY;
      if (!NAN(fVar1)) {
        dVar5 = (double)fVar1;
      }
      dVar6 = -INFINITY;
      if (!NAN(fVar1)) {
        dVar6 = (double)fVar1;
      }
      if (((dVar5 < local_48.m_lo) || (local_48.m_hi < dVar6)) ||
         ((NAN(fVar1) && (local_48.m_hasNaN == false)))) {
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        os = (ostream *)std::ostream::operator<<(this_00,(int)uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(os,"] = ",4);
        tcu::operator<<(os,&local_48);
        return bVar4;
      }
      uVar3 = uVar3 + 1;
      bVar4 = uVar2 <= uVar3;
    } while (uVar3 != uVar2);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}